

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

void mi_option_enable(mi_option_t option)

{
  ulong uVar1;
  
  uVar1 = (ulong)option;
  if (option < _mi_option_last) {
    do {
      while( true ) {
        options[uVar1].value = 1;
        options[uVar1].init = INITIALIZED;
        if (options[uVar1].option == mi_option_guarded_max) break;
        if (options[uVar1].option != mi_option_guarded_min) {
          return;
        }
        uVar1 = 0x1f;
        if (0 < options[0x1f].value) {
          return;
        }
      }
      uVar1 = 0x1e;
    } while (1 < options[0x1e].value);
  }
  return;
}

Assistant:

void mi_option_enable(mi_option_t option) {
  mi_option_set_enabled(option,true);
}